

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

float GGUFMeta::GKV<float>::get_kv(gguf_context *ctx,int k)

{
  int iVar1;
  runtime_error *this;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  float fVar6;
  string local_40;
  
  lVar5 = (long)k;
  iVar1 = gguf_get_kv_type(ctx,lVar5);
  if (iVar1 == 6) {
    fVar6 = (float)gguf_get_val_f32(ctx,lVar5);
    return fVar6;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar2 = gguf_get_key(ctx,lVar5);
  uVar3 = gguf_type_name(iVar1);
  uVar4 = gguf_type_name(6);
  format_abi_cxx11_(&local_40,"key %s has wrong type %s but expected type %s",uVar2,uVar3,uVar4);
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T get_kv(const gguf_context * ctx, const int k) {
            const enum gguf_type kt = gguf_get_kv_type(ctx, k);

            if (kt != GKV::gt) {
                throw std::runtime_error(format("key %s has wrong type %s but expected type %s",
                    gguf_get_key(ctx, k), gguf_type_name(kt), gguf_type_name(GKV::gt)));
            }
            return GKV::getter(ctx, k);
        }